

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioning.cpp
# Opt level: O2

void __thiscall duckdb::RadixPartitionedTupleData::Initialize(RadixPartitionedTupleData *this)

{
  idx_t iVar1;
  pointer this_00;
  ulong index;
  
  iVar1 = this->radix_bits;
  for (index = 0; index >> ((byte)iVar1 & 0x3f) == 0; index = index + 1) {
    PartitionedTupleData::CreatePartitionCollection
              ((PartitionedTupleData *)&stack0xffffffffffffffd0,(idx_t)this);
    ::std::
    vector<duckdb::unique_ptr<duckdb::TupleDataCollection,std::default_delete<duckdb::TupleDataCollection>,true>,std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,std::default_delete<duckdb::TupleDataCollection>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::TupleDataCollection,std::default_delete<duckdb::TupleDataCollection>,true>>
              ((vector<duckdb::unique_ptr<duckdb::TupleDataCollection,std::default_delete<duckdb::TupleDataCollection>,true>,std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,std::default_delete<duckdb::TupleDataCollection>,true>>>
                *)&(this->super_PartitionedTupleData).partitions,
               (unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                *)&stack0xffffffffffffffd0);
    ::std::
    unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>::
    ~unique_ptr((unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                 *)&stack0xffffffffffffffd0);
    this_00 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator->((this->super_PartitionedTupleData).partitions.
                           super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1);
    TupleDataCollection::SetPartitionIndex(this_00,index);
  }
  return;
}

Assistant:

void RadixPartitionedTupleData::Initialize() {
	const auto num_partitions = RadixPartitioning::NumberOfPartitions(radix_bits);
	for (idx_t i = 0; i < num_partitions; i++) {
		partitions.emplace_back(CreatePartitionCollection(i));
		partitions.back()->SetPartitionIndex(i);
	}
}